

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathRegisterVariableNS
              (xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri,xmlXPathObjectPtr value)

{
  int iVar1;
  xmlHashTablePtr table;
  
  if (name == (xmlChar *)0x0 || ctxt == (xmlXPathContextPtr)0x0) {
    return -1;
  }
  table = ctxt->varHash;
  if (table == (xmlHashTablePtr)0x0) {
    table = xmlHashCreate(0);
    ctxt->varHash = table;
    if (table == (xmlHashTablePtr)0x0) {
      return -1;
    }
  }
  if (value == (xmlXPathObjectPtr)0x0) {
    iVar1 = xmlHashRemoveEntry2(table,name,ns_uri,xmlXPathFreeObjectEntry);
    return iVar1;
  }
  iVar1 = xmlHashUpdateEntry2(table,name,ns_uri,value,xmlXPathFreeObjectEntry);
  return iVar1;
}

Assistant:

int
xmlXPathRegisterVariableNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			   const xmlChar *ns_uri,
			   xmlXPathObjectPtr value) {
    if (ctxt == NULL)
	return(-1);
    if (name == NULL)
	return(-1);

    if (ctxt->varHash == NULL)
	ctxt->varHash = xmlHashCreate(0);
    if (ctxt->varHash == NULL)
	return(-1);
    if (value == NULL)
        return(xmlHashRemoveEntry2(ctxt->varHash, name, ns_uri,
	                           xmlXPathFreeObjectEntry));
    return(xmlHashUpdateEntry2(ctxt->varHash, name, ns_uri,
			       (void *) value, xmlXPathFreeObjectEntry));
}